

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

_Bool object_has_rune(object *obj,wchar_t rune_no)

{
  byte bVar1;
  object_kind *poVar2;
  _Bool *p_Var3;
  rune *prVar4;
  _Bool _Var5;
  int iVar6;
  char **ppcVar7;
  ulong uVar8;
  
  prVar4 = rune_list;
  switch(rune_list[rune_no].variety) {
  case RUNE_VAR_COMBAT:
    if (rune_list[rune_no].index == 1) {
      _Var5 = object_has_standard_to_h(obj);
      if (!_Var5) {
        return true;
      }
    }
    else if ((rune_list[rune_no].index == 0) && (obj->to_a != 0)) {
      return true;
    }
    if (prVar4[rune_no].index == 3) {
      if (((obj->kind != (object_kind *)0x0) && (_Var5 = tval_is_body_armor(obj), _Var5)) &&
         (obj->kind->ac != (int)obj->ac)) {
        return true;
      }
    }
    else if ((prVar4[rune_no].index == 2) && (obj->to_d != 0)) {
      return true;
    }
    if ((prVar4[rune_no].index == 4) && (poVar2 = obj->kind, poVar2 != (object_kind *)0x0)) {
      if (poVar2->dd != (uint)obj->dd) {
        return true;
      }
      if (poVar2->ds != (uint)obj->ds) {
        return true;
      }
    }
    break;
  case RUNE_VAR_MOD:
    if (obj->modifiers[rune_list[rune_no].index] != 0) {
      return true;
    }
    break;
  case RUNE_VAR_RESIST:
    if (obj->el_info[rune_list[rune_no].index].res_level != 100) {
      return true;
    }
    break;
  case RUNE_VAR_BRAND:
    p_Var3 = obj->brands;
    if ((p_Var3 != (_Bool *)0x0) && (bVar1 = z_info->brand_max, (ulong)bVar1 != 0)) {
      ppcVar7 = &brands->name;
      uVar8 = 0;
      do {
        if ((p_Var3[uVar8] == true) && (iVar6 = strcmp(*ppcVar7,prVar4[rune_no].name), iVar6 == 0))
        {
          return true;
        }
        uVar8 = uVar8 + 1;
        ppcVar7 = ppcVar7 + 6;
      } while (bVar1 != uVar8);
    }
    break;
  case RUNE_VAR_SLAY:
    if ((obj->slays != (_Bool *)0x0) && (z_info->slay_max != '\0')) {
      uVar8 = 0;
      do {
        if ((obj->slays[uVar8] == true) &&
           (_Var5 = same_monsters_slain(prVar4[rune_no].index,(wchar_t)uVar8), _Var5)) {
          return true;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < z_info->slay_max);
    }
    break;
  case RUNE_VAR_CURSE:
    if ((obj->curses != (curse_data *)0x0) && (obj->curses[rune_list[rune_no].index].power != L'\0')
       ) {
      return true;
    }
    break;
  case RUNE_VAR_FLAG:
    _Var5 = flag_has_dbg(obj->flags,6,rune_list[rune_no].index,"obj->flags","r->index");
    if (_Var5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool object_has_rune(const struct object *obj, int rune_no)
{
	struct rune *r = &rune_list[rune_no];

	switch (r->variety) {
		/* Combat runes - just check them all */
		case RUNE_VAR_COMBAT: {
			if ((r->index == COMBAT_RUNE_TO_A) && (obj->to_a))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_H) &&
					 !object_has_standard_to_h(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_D) && (obj->to_d))
				return true;
			else if ((r->index == COMBAT_RUNE_AC) &&
					 !object_has_standard_ac(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_DICE) &&
					 !object_has_standard_dice(obj))
				return true;
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (obj->modifiers[r->index] != 0)
				return true;
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (obj->el_info[r->index].res_level != RES_LEVEL_BASE)
				return true;
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			if (obj->brands) {
				int i;
				for (i = 0; i < z_info->brand_max; i++) {
					if (obj->brands[i] && streq(brands[i].name, r->name)) {
						return true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			if (obj->slays) {
				int i;
				for (i = 0; i < z_info->slay_max; i++) {
					if (obj->slays[i] && same_monsters_slain(r->index, i)) {
						return true;
					}
				}
			}
			break;
		}
		/* Curse runes */
		case RUNE_VAR_CURSE: {
			if (obj->curses && obj->curses[r->index].power)
				return true;
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_has(obj->flags, r->index))
				return true;
			break;
		}
		default: break;
	}

	return false;
}